

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O3

void __thiscall wallet::wallet_tests::LoadReceiveRequests::test_method(LoadReceiveRequests *this)

{
  function<void_(std::shared_ptr<wallet::CWallet>)> f;
  function<void_(std::shared_ptr<wallet::CWallet>)> f_00;
  function<void_(std::shared_ptr<wallet::CWallet>)> f_01;
  long in_FS_OFFSET;
  DatabaseFormat format;
  string name;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  _Manager_type in_stack_ffffffffffffff68;
  code *pcVar1;
  _Invoker_type in_stack_ffffffffffffff70;
  undefined8 local_88;
  undefined8 uStack_80;
  code *local_78;
  code *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  code *local_58;
  code *local_50;
  DatabaseFormat local_44;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = SQLITE;
  tinyformat::format<wallet::DatabaseFormat>(&local_40,"receive-requests-%i",&local_44);
  local_68 = 0;
  uStack_60 = 0;
  local_50 = std::
             _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:465:38)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:465:38)>
             ::_M_manager;
  f.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff60;
  f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff58;
  f.super__Function_base._M_manager = in_stack_ffffffffffffff68;
  f._M_invoker = in_stack_ffffffffffffff70;
  TestLoadWallet(&local_40,local_44,f);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  local_88 = 0;
  uStack_80 = 0;
  local_70 = std::
             _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:476:38)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:476:38)>
             ::_M_manager;
  f_00.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff60;
  f_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff58;
  f_00.super__Function_base._M_manager = in_stack_ffffffffffffff68;
  f_00._M_invoker = in_stack_ffffffffffffff70;
  TestLoadWallet(&local_40,local_44,f_00);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  pcVar1 = std::
           _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:488:38)>
           ::_M_manager;
  f_01.super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:488:38)>
       ::_M_manager;
  f_01.super__Function_base._M_functor = (_Any_data)ZEXT816(0);
  f_01._M_invoker =
       std::
       _Function_handler<void_(std::shared_ptr<wallet::CWallet>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp:488:38)>
       ::_M_invoke;
  TestLoadWallet(&local_40,local_44,f_01);
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&stack0xffffffffffffff58,&stack0xffffffffffffff58,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(LoadReceiveRequests, TestingSetup)
{
    for (DatabaseFormat format : DATABASE_FORMATS) {
        const std::string name{strprintf("receive-requests-%i", format)};
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(PKHash()));
            WalletBatch batch{wallet->GetDatabase()};
            BOOST_CHECK(batch.WriteAddressPreviouslySpent(PKHash(), true));
            BOOST_CHECK(batch.WriteAddressPreviouslySpent(ScriptHash(), true));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "0", "val_rr00"));
            BOOST_CHECK(wallet->EraseAddressReceiveRequest(batch, PKHash(), "0"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "1", "val_rr10"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, PKHash(), "1", "val_rr11"));
            BOOST_CHECK(wallet->SetAddressReceiveRequest(batch, ScriptHash(), "2", "val_rr20"));
        });
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(wallet->IsAddressPreviouslySpent(PKHash()));
            BOOST_CHECK(wallet->IsAddressPreviouslySpent(ScriptHash()));
            auto requests = wallet->GetAddressReceiveRequests();
            auto erequests = {"val_rr11", "val_rr20"};
            BOOST_CHECK_EQUAL_COLLECTIONS(requests.begin(), requests.end(), std::begin(erequests), std::end(erequests));
            RunWithinTxn(wallet->GetDatabase(), /*process_desc*/"test", [](WalletBatch& batch){
                BOOST_CHECK(batch.WriteAddressPreviouslySpent(PKHash(), false));
                BOOST_CHECK(batch.EraseAddressData(ScriptHash()));
                return true;
            });
        });
        TestLoadWallet(name, format, [](std::shared_ptr<CWallet> wallet) EXCLUSIVE_LOCKS_REQUIRED(wallet->cs_wallet) {
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(PKHash()));
            BOOST_CHECK(!wallet->IsAddressPreviouslySpent(ScriptHash()));
            auto requests = wallet->GetAddressReceiveRequests();
            auto erequests = {"val_rr11"};
            BOOST_CHECK_EQUAL_COLLECTIONS(requests.begin(), requests.end(), std::begin(erequests), std::end(erequests));
        });
    }
}